

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md.c
# Opt level: O0

void mbedtls_md_free(mbedtls_md_context_t *ctx)

{
  mbedtls_md_context_t *ctx_local;
  
  if ((ctx != (mbedtls_md_context_t *)0x0) && (ctx->md_info != (mbedtls_md_info_t *)0x0)) {
    if (ctx->md_ctx != (void *)0x0) {
      (*ctx->md_info->ctx_free_func)(ctx->md_ctx);
    }
    if (ctx->hmac_ctx != (void *)0x0) {
      mbedtls_zeroize(ctx->hmac_ctx,(long)(ctx->md_info->block_size << 1));
      free(ctx->hmac_ctx);
    }
    mbedtls_zeroize(ctx,0x18);
  }
  return;
}

Assistant:

void mbedtls_md_free( mbedtls_md_context_t *ctx )
{
    if( ctx == NULL || ctx->md_info == NULL )
        return;

    if( ctx->md_ctx != NULL )
        ctx->md_info->ctx_free_func( ctx->md_ctx );

    if( ctx->hmac_ctx != NULL )
    {
        mbedtls_zeroize( ctx->hmac_ctx, 2 * ctx->md_info->block_size );
        mbedtls_free( ctx->hmac_ctx );
    }

    mbedtls_zeroize( ctx, sizeof( mbedtls_md_context_t ) );
}